

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar18;
  byte bVar19;
  uint uVar20;
  long lVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar33 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined4 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar69;
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 local_2618 [16];
  ulong local_2600;
  StackItemT<embree::NodeRefPtr<8>_> *local_25f8;
  Scene *local_25f0;
  RTCFilterFunctionNArguments args;
  float local_2568 [4];
  float local_2558 [4];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_25f8 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar73 = ZEXT3264(auVar46);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar74 = ZEXT3264(auVar47);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar75 = ZEXT3264(auVar48);
  auVar33 = vmulss_avx512f(auVar46._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar53 = auVar33._0_4_;
  auVar46._4_4_ = uVar53;
  auVar46._0_4_ = uVar53;
  auVar46._8_4_ = uVar53;
  auVar46._12_4_ = uVar53;
  auVar46._16_4_ = uVar53;
  auVar46._20_4_ = uVar53;
  auVar46._24_4_ = uVar53;
  auVar46._28_4_ = uVar53;
  auVar33 = vmulss_avx512f(auVar47._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar53 = auVar33._0_4_;
  auVar47._4_4_ = uVar53;
  auVar47._0_4_ = uVar53;
  auVar47._8_4_ = uVar53;
  auVar47._12_4_ = uVar53;
  auVar47._16_4_ = uVar53;
  auVar47._20_4_ = uVar53;
  auVar47._24_4_ = uVar53;
  auVar47._28_4_ = uVar53;
  auVar33 = vmulss_avx512f(auVar48._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar53 = auVar33._0_4_;
  auVar48._4_4_ = uVar53;
  auVar48._0_4_ = uVar53;
  auVar48._8_4_ = uVar53;
  auVar48._12_4_ = uVar53;
  auVar48._16_4_ = uVar53;
  auVar48._20_4_ = uVar53;
  auVar48._24_4_ = uVar53;
  auVar48._28_4_ = uVar53;
  local_2600 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar27 = local_2600 ^ 0x20;
  iVar1 = (tray->tfar).field_0.i[k];
  auVar57 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  auVar49._8_4_ = 0x80000000;
  auVar49._0_8_ = 0x8000000080000000;
  auVar49._12_4_ = 0x80000000;
  auVar49._16_4_ = 0x80000000;
  auVar49._20_4_ = 0x80000000;
  auVar49._24_4_ = 0x80000000;
  auVar49._28_4_ = 0x80000000;
  auVar46 = vxorps_avx512vl(auVar46,auVar49);
  auVar76 = ZEXT3264(auVar46);
  auVar46 = vxorps_avx512vl(auVar47,auVar49);
  auVar77 = ZEXT3264(auVar46);
  auVar46 = vxorps_avx512vl(auVar48,auVar49);
  auVar78 = ZEXT3264(auVar46);
  auVar46 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar79 = ZEXT3264(auVar46);
  auVar33 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar80 = ZEXT1664(auVar33);
  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar81 = ZEXT3264(auVar46);
  auVar46 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar82 = ZEXT3264(auVar46);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar83 = ZEXT1664(auVar33);
  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
  auVar84 = ZEXT3264(auVar46);
  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
  auVar85 = ZEXT3264(auVar46);
  do {
    pSVar18 = local_25f8 + -1;
    local_25f8 = local_25f8 + -1;
    if ((float)pSVar18->dist <= *(float *)(ray + k * 4 + 0x80)) {
      sVar29 = (local_25f8->ptr).ptr;
      while ((sVar29 & 8) == 0) {
        auVar46 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar29 + 0x40 + local_2600),auVar76._0_32_,
                             auVar73._0_32_);
        auVar47 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar29 + 0x40 + uVar26),auVar77._0_32_,
                             auVar74._0_32_);
        auVar46 = vpmaxsd_avx2(auVar46,auVar47);
        auVar47 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar29 + 0x40 + uVar31),auVar78._0_32_,
                             auVar75._0_32_);
        auVar47 = vpmaxsd_avx512vl(auVar47,auVar79._0_32_);
        auVar46 = vpmaxsd_avx2(auVar46,auVar47);
        auVar47 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar29 + 0x40 + uVar27),auVar76._0_32_,
                             auVar73._0_32_);
        auVar48 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar29 + 0x40 + (uVar26 ^ 0x20)),auVar77._0_32_,
                             auVar74._0_32_);
        auVar47 = vpminsd_avx2(auVar47,auVar48);
        auVar48 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar29 + 0x40 + (uVar31 ^ 0x20)),auVar78._0_32_,
                             auVar75._0_32_);
        auVar48 = vpminsd_avx2(auVar48,auVar57._0_32_);
        auVar47 = vpminsd_avx2(auVar47,auVar48);
        uVar25 = vpcmpd_avx512vl(auVar46,auVar47,2);
        bVar19 = (byte)uVar25;
        if (bVar19 == 0) goto LAB_0077cb7a;
        auVar47 = *(undefined1 (*) [32])(sVar29 & 0xfffffffffffffff0);
        auVar48 = ((undefined1 (*) [32])(sVar29 & 0xfffffffffffffff0))[1];
        auVar49 = vmovdqa64_avx512vl(auVar81._0_32_);
        auVar49 = vpternlogd_avx512vl(auVar49,auVar46,auVar82._0_32_,0xf8);
        auVar50 = vpcompressd_avx512vl(auVar49);
        auVar51._0_4_ =
             (uint)(bVar19 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar49._0_4_;
        bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar7 * auVar50._4_4_ | (uint)!bVar7 * auVar49._4_4_;
        bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar7 * auVar50._8_4_ | (uint)!bVar7 * auVar49._8_4_;
        bVar7 = (bool)((byte)(uVar25 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar7 * auVar50._12_4_ | (uint)!bVar7 * auVar49._12_4_;
        bVar7 = (bool)((byte)(uVar25 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar7 * auVar50._16_4_ | (uint)!bVar7 * auVar49._16_4_;
        bVar7 = (bool)((byte)(uVar25 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar7 * auVar50._20_4_ | (uint)!bVar7 * auVar49._20_4_;
        bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar7 * auVar50._24_4_ | (uint)!bVar7 * auVar49._24_4_;
        bVar7 = SUB81(uVar25 >> 7,0);
        auVar51._28_4_ = (uint)bVar7 * auVar50._28_4_ | (uint)!bVar7 * auVar49._28_4_;
        auVar49 = vpermt2q_avx512vl(auVar47,auVar51,auVar48);
        sVar29 = auVar49._0_8_;
        bVar19 = bVar19 - 1 & bVar19;
        if (bVar19 != 0) {
          auVar49 = vpshufd_avx2(auVar51,0x55);
          vpermt2q_avx512vl(auVar47,auVar49,auVar48);
          auVar50 = vpminsd_avx2(auVar51,auVar49);
          auVar49 = vpmaxsd_avx2(auVar51,auVar49);
          bVar19 = bVar19 - 1 & bVar19;
          if (bVar19 == 0) {
            auVar51 = vpermi2q_avx512vl(auVar50,auVar47,auVar48);
            sVar29 = auVar51._0_8_;
            auVar47 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
            (local_25f8->ptr).ptr = auVar47._0_8_;
            auVar46 = vpermd_avx2(auVar49,auVar46);
            local_25f8->dist = auVar46._0_4_;
            local_25f8 = local_25f8 + 1;
          }
          else {
            auVar9 = vpshufd_avx2(auVar51,0xaa);
            vpermt2q_avx512vl(auVar47,auVar9,auVar48);
            auVar63 = vpminsd_avx2(auVar50,auVar9);
            auVar50 = vpmaxsd_avx2(auVar50,auVar9);
            auVar9 = vpminsd_avx2(auVar49,auVar50);
            auVar49 = vpmaxsd_avx2(auVar49,auVar50);
            bVar19 = bVar19 - 1 & bVar19;
            if (bVar19 == 0) {
              auVar51 = vpermi2q_avx512vl(auVar63,auVar47,auVar48);
              sVar29 = auVar51._0_8_;
              auVar51 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
              (local_25f8->ptr).ptr = auVar51._0_8_;
              auVar49 = vpermd_avx2(auVar49,auVar46);
              local_25f8->dist = auVar49._0_4_;
              auVar47 = vpermt2q_avx512vl(auVar47,auVar9,auVar48);
              local_25f8[1].ptr.ptr = auVar47._0_8_;
              auVar46 = vpermd_avx2(auVar9,auVar46);
              local_25f8[1].dist = auVar46._0_4_;
              local_25f8 = local_25f8 + 2;
            }
            else {
              auVar50 = vpshufd_avx2(auVar51,0xff);
              vpermt2q_avx512vl(auVar47,auVar50,auVar48);
              auVar8 = vpminsd_avx2(auVar63,auVar50);
              auVar50 = vpmaxsd_avx2(auVar63,auVar50);
              auVar63 = vpminsd_avx2(auVar9,auVar50);
              auVar50 = vpmaxsd_avx2(auVar9,auVar50);
              auVar9 = vpminsd_avx2(auVar49,auVar50);
              auVar49 = vpmaxsd_avx2(auVar49,auVar50);
              bVar19 = bVar19 - 1 & bVar19;
              if (bVar19 == 0) {
                auVar51 = vpermi2q_avx512vl(auVar8,auVar47,auVar48);
                sVar29 = auVar51._0_8_;
                auVar51 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
                (local_25f8->ptr).ptr = auVar51._0_8_;
                auVar49 = vpermd_avx2(auVar49,auVar46);
                local_25f8->dist = auVar49._0_4_;
                auVar49 = vpermt2q_avx512vl(auVar47,auVar9,auVar48);
                local_25f8[1].ptr.ptr = auVar49._0_8_;
                auVar49 = vpermd_avx2(auVar9,auVar46);
                local_25f8[1].dist = auVar49._0_4_;
                auVar47 = vpermt2q_avx512vl(auVar47,auVar63,auVar48);
                local_25f8[2].ptr.ptr = auVar47._0_8_;
                auVar46 = vpermd_avx2(auVar63,auVar46);
                local_25f8[2].dist = auVar46._0_4_;
                local_25f8 = local_25f8 + 3;
              }
              else {
                auVar52 = valignd_avx512vl(auVar51,auVar51,3);
                auVar51 = vpermt2d_avx512vl(auVar83._0_32_,auVar84._0_32_,auVar8);
                auVar51 = vpermt2d_avx512vl(auVar51,auVar85._0_32_,auVar63);
                auVar50 = vpermt2d_avx512vl(auVar51,auVar85._0_32_,auVar9);
                auVar51 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar49 = vpermt2d_avx512vl(auVar50,auVar51,auVar49);
                auVar64 = ZEXT3264(auVar49);
                bVar22 = bVar19;
                do {
                  auVar51 = auVar64._0_32_;
                  auVar63._8_4_ = 1;
                  auVar63._0_8_ = 0x100000001;
                  auVar63._12_4_ = 1;
                  auVar63._16_4_ = 1;
                  auVar63._20_4_ = 1;
                  auVar63._24_4_ = 1;
                  auVar63._28_4_ = 1;
                  auVar49 = vpermd_avx2(auVar63,auVar52);
                  auVar52 = valignd_avx512vl(auVar52,auVar52,1);
                  vpermt2q_avx512vl(auVar47,auVar52,auVar48);
                  bVar22 = bVar22 - 1 & bVar22;
                  uVar13 = vpcmpd_avx512vl(auVar49,auVar51,5);
                  auVar49 = vpmaxsd_avx2(auVar49,auVar51);
                  bVar14 = (byte)uVar13 << 1;
                  auVar51 = valignd_avx512vl(auVar51,auVar51,7);
                  bVar7 = (bool)((byte)uVar13 & 1);
                  auVar50._4_4_ = (uint)bVar7 * auVar51._4_4_ | (uint)!bVar7 * auVar49._4_4_;
                  auVar50._0_4_ = auVar49._0_4_;
                  bVar7 = (bool)(bVar14 >> 2 & 1);
                  auVar50._8_4_ = (uint)bVar7 * auVar51._8_4_ | (uint)!bVar7 * auVar49._8_4_;
                  bVar7 = (bool)(bVar14 >> 3 & 1);
                  auVar50._12_4_ = (uint)bVar7 * auVar51._12_4_ | (uint)!bVar7 * auVar49._12_4_;
                  bVar7 = (bool)(bVar14 >> 4 & 1);
                  auVar50._16_4_ = (uint)bVar7 * auVar51._16_4_ | (uint)!bVar7 * auVar49._16_4_;
                  bVar7 = (bool)(bVar14 >> 5 & 1);
                  auVar50._20_4_ = (uint)bVar7 * auVar51._20_4_ | (uint)!bVar7 * auVar49._20_4_;
                  bVar7 = (bool)(bVar14 >> 6 & 1);
                  auVar50._24_4_ = (uint)bVar7 * auVar51._24_4_ | (uint)!bVar7 * auVar49._24_4_;
                  auVar50._28_4_ =
                       (uint)(bVar14 >> 7) * auVar51._28_4_ |
                       (uint)!(bool)(bVar14 >> 7) * auVar49._28_4_;
                  auVar64 = ZEXT3264(auVar50);
                } while (bVar22 != 0);
                lVar21 = (ulong)(uint)POPCOUNT((uint)bVar19) + 3;
                do {
                  auVar49 = vpermi2q_avx512vl(auVar50,auVar47,auVar48);
                  (local_25f8->ptr).ptr = auVar49._0_8_;
                  auVar51 = auVar64._0_32_;
                  auVar49 = vpermd_avx2(auVar51,auVar46);
                  local_25f8->dist = auVar49._0_4_;
                  auVar50 = valignd_avx512vl(auVar51,auVar51,1);
                  local_25f8 = local_25f8 + 1;
                  auVar64 = ZEXT3264(auVar50);
                  lVar21 = lVar21 + -1;
                } while (lVar21 != 0);
                auVar46 = vpermt2q_avx512vl(auVar47,auVar50,auVar48);
                sVar29 = auVar46._0_8_;
              }
            }
          }
        }
      }
      uVar25 = (ulong)((uint)sVar29 & 0xf);
      if (uVar25 != 8) {
        uVar30 = sVar29 & 0xfffffffffffffff0;
        lVar21 = 0;
        do {
          lVar28 = lVar21 * 0xb0;
          auVar33 = *(undefined1 (*) [16])(uVar30 + 0x80 + lVar28);
          auVar65 = *(undefined1 (*) [16])(uVar30 + 0x40 + lVar28);
          auVar62 = *(undefined1 (*) [16])(uVar30 + 0x70 + lVar28);
          auVar43 = *(undefined1 (*) [16])(uVar30 + 0x50 + lVar28);
          auVar34._0_4_ = auVar65._0_4_ * auVar33._0_4_;
          auVar34._4_4_ = auVar65._4_4_ * auVar33._4_4_;
          auVar34._8_4_ = auVar65._8_4_ * auVar33._8_4_;
          auVar34._12_4_ = auVar65._12_4_ * auVar33._12_4_;
          auVar66 = *(undefined1 (*) [16])(uVar30 + 0x60 + lVar28);
          auVar67 = *(undefined1 (*) [16])(uVar30 + 0x30 + lVar28);
          local_2538 = vfmsub231ps_fma(auVar34,auVar62,auVar43);
          auVar38._0_4_ = auVar43._0_4_ * auVar66._0_4_;
          auVar38._4_4_ = auVar43._4_4_ * auVar66._4_4_;
          auVar38._8_4_ = auVar43._8_4_ * auVar66._8_4_;
          auVar38._12_4_ = auVar43._12_4_ * auVar66._12_4_;
          local_2528 = vfmsub231ps_fma(auVar38,auVar33,auVar67);
          auVar39._0_4_ = auVar67._0_4_ * auVar62._0_4_;
          auVar39._4_4_ = auVar67._4_4_ * auVar62._4_4_;
          auVar39._8_4_ = auVar67._8_4_ * auVar62._8_4_;
          auVar39._12_4_ = auVar67._12_4_ * auVar62._12_4_;
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar42._4_4_ = uVar53;
          auVar42._0_4_ = uVar53;
          auVar42._8_4_ = uVar53;
          auVar42._12_4_ = uVar53;
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar71._4_4_ = uVar53;
          auVar71._0_4_ = uVar53;
          auVar71._8_4_ = uVar53;
          auVar71._12_4_ = uVar53;
          fVar70 = *(float *)(ray + k * 4 + 0x60);
          auVar40._4_4_ = fVar70;
          auVar40._0_4_ = fVar70;
          auVar40._8_4_ = fVar70;
          auVar40._12_4_ = fVar70;
          uVar53 = *(undefined4 *)(ray + k * 4);
          auVar37._4_4_ = uVar53;
          auVar37._0_4_ = uVar53;
          auVar37._8_4_ = uVar53;
          auVar37._12_4_ = uVar53;
          auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + lVar28),auVar37);
          local_2518 = vfmsub231ps_fma(auVar39,auVar66,auVar65);
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar35._4_4_ = uVar53;
          auVar35._0_4_ = uVar53;
          auVar35._8_4_ = uVar53;
          auVar35._12_4_ = uVar53;
          auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x10 + lVar28),auVar35);
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar36._4_4_ = uVar53;
          auVar36._0_4_ = uVar53;
          auVar36._8_4_ = uVar53;
          auVar36._12_4_ = uVar53;
          auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x20 + lVar28),auVar36);
          auVar37 = vmulps_avx512vl(auVar71,auVar36);
          auVar38 = vfmsub231ps_avx512vl(auVar37,auVar35,auVar40);
          auVar37 = vmulps_avx512vl(auVar40,auVar34);
          auVar39 = vfmsub231ps_avx512vl(auVar37,auVar36,auVar42);
          auVar37 = vmulps_avx512vl(auVar42,auVar35);
          auVar40 = vfmsub231ps_avx512vl(auVar37,auVar34,auVar71);
          auVar72._0_4_ = fVar70 * local_2518._0_4_;
          auVar72._4_4_ = fVar70 * local_2518._4_4_;
          auVar72._8_4_ = fVar70 * local_2518._8_4_;
          auVar72._12_4_ = fVar70 * local_2518._12_4_;
          auVar37 = vfmadd231ps_fma(auVar72,local_2528,auVar71);
          auVar37 = vfmadd231ps_fma(auVar37,local_2538,auVar42);
          auVar41._8_4_ = 0x7fffffff;
          auVar41._0_8_ = 0x7fffffff7fffffff;
          auVar41._12_4_ = 0x7fffffff;
          auVar41 = vandps_avx512vl(auVar37,auVar41);
          auVar42 = vandps_avx512vl(auVar37,auVar83._0_16_);
          auVar33 = vmulps_avx512vl(auVar33,auVar40);
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar39,auVar62);
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar38,auVar66);
          uVar23 = auVar42._0_4_;
          auVar62._0_4_ = (float)(uVar23 ^ auVar33._0_4_);
          uVar69 = auVar42._4_4_;
          auVar62._4_4_ = (float)(uVar69 ^ auVar33._4_4_);
          uVar24 = auVar42._8_4_;
          auVar62._8_4_ = (float)(uVar24 ^ auVar33._8_4_);
          uVar20 = auVar42._12_4_;
          auVar62._12_4_ = (float)(uVar20 ^ auVar33._12_4_);
          auVar33 = vmulps_avx512vl(auVar43,auVar40);
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar65,auVar39);
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar67,auVar38);
          auVar65._0_4_ = (float)(uVar23 ^ auVar33._0_4_);
          auVar65._4_4_ = (float)(uVar69 ^ auVar33._4_4_);
          auVar65._8_4_ = (float)(uVar24 ^ auVar33._8_4_);
          auVar65._12_4_ = (float)(uVar20 ^ auVar33._12_4_);
          auVar33 = ZEXT816(0) << 0x20;
          uVar13 = vcmpps_avx512vl(auVar62,auVar33,5);
          uVar10 = vcmpps_avx512vl(auVar65,auVar33,5);
          uVar11 = vcmpps_avx512vl(auVar37,auVar33,4);
          auVar33._0_4_ = auVar62._0_4_ + auVar65._0_4_;
          auVar33._4_4_ = auVar62._4_4_ + auVar65._4_4_;
          auVar33._8_4_ = auVar62._8_4_ + auVar65._8_4_;
          auVar33._12_4_ = auVar62._12_4_ + auVar65._12_4_;
          uVar12 = vcmpps_avx512vl(auVar33,auVar41,2);
          bVar19 = (byte)uVar13 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
          if (bVar19 != 0) {
            auVar67._0_4_ = auVar36._0_4_ * local_2518._0_4_;
            auVar67._4_4_ = auVar36._4_4_ * local_2518._4_4_;
            auVar67._8_4_ = auVar36._8_4_ * local_2518._8_4_;
            auVar67._12_4_ = auVar36._12_4_ * local_2518._12_4_;
            auVar33 = vfmadd213ps_fma(auVar35,local_2528,auVar67);
            auVar33 = vfmadd213ps_fma(auVar34,local_2538,auVar33);
            uVar53 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar43._4_4_ = uVar53;
            auVar43._0_4_ = uVar53;
            auVar43._8_4_ = uVar53;
            auVar43._12_4_ = uVar53;
            auVar43 = vmulps_avx512vl(auVar41,auVar43);
            fVar70 = *(float *)(ray + k * 4 + 0x80);
            auVar66._0_4_ = (float)(uVar23 ^ auVar33._0_4_);
            auVar66._4_4_ = (float)(uVar69 ^ auVar33._4_4_);
            auVar66._8_4_ = (float)(uVar24 ^ auVar33._8_4_);
            auVar66._12_4_ = (float)(uVar20 ^ auVar33._12_4_);
            auVar68._0_4_ = fVar70 * auVar41._0_4_;
            auVar68._4_4_ = fVar70 * auVar41._4_4_;
            auVar68._8_4_ = fVar70 * auVar41._8_4_;
            auVar68._12_4_ = fVar70 * auVar41._12_4_;
            uVar13 = vcmpps_avx512vl(auVar66,auVar68,2);
            uVar10 = vcmpps_avx512vl(auVar43,auVar66,1);
            bVar19 = (byte)uVar13 & (byte)uVar10 & bVar19;
            if (bVar19 != 0) {
              local_25f0 = context->scene;
              auVar33 = vrcp14ps_avx512vl(auVar41);
              auVar15._8_4_ = 0x3f800000;
              auVar15._0_8_ = 0x3f8000003f800000;
              auVar15._12_4_ = 0x3f800000;
              auVar43 = vfnmadd213ps_avx512vl(auVar41,auVar33,auVar15);
              auVar33 = vfmadd132ps_fma(auVar43,auVar33,auVar33);
              fVar58 = auVar33._0_4_;
              local_2548._0_4_ = fVar58 * auVar66._0_4_;
              fVar59 = auVar33._4_4_;
              local_2548._4_4_ = fVar59 * auVar66._4_4_;
              fVar60 = auVar33._8_4_;
              local_2548._8_4_ = fVar60 * auVar66._8_4_;
              fVar61 = auVar33._12_4_;
              local_2548._12_4_ = fVar61 * auVar66._12_4_;
              auVar57 = ZEXT1664(local_2548);
              local_2568[0] = fVar58 * auVar62._0_4_;
              local_2568[1] = fVar59 * auVar62._4_4_;
              local_2568[2] = fVar60 * auVar62._8_4_;
              local_2568[3] = fVar61 * auVar62._12_4_;
              local_2558[0] = fVar58 * auVar65._0_4_;
              local_2558[1] = fVar59 * auVar65._4_4_;
              local_2558[2] = fVar60 * auVar65._8_4_;
              local_2558[3] = fVar61 * auVar65._12_4_;
              lVar28 = lVar28 + uVar30;
              auVar54._8_4_ = 0x7f800000;
              auVar54._0_8_ = 0x7f8000007f800000;
              auVar54._12_4_ = 0x7f800000;
              auVar33 = vblendmps_avx512vl(auVar54,local_2548);
              auVar44._0_4_ =
                   (uint)(bVar19 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar19 & 1) * 0x7f800000;
              bVar7 = (bool)(bVar19 >> 1 & 1);
              auVar44._4_4_ = (uint)bVar7 * auVar33._4_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar19 >> 2 & 1);
              auVar44._8_4_ = (uint)bVar7 * auVar33._8_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar19 >> 3 & 1);
              auVar44._12_4_ = (uint)bVar7 * auVar33._12_4_ | (uint)!bVar7 * 0x7f800000;
              auVar33 = vshufps_avx(auVar44,auVar44,0xb1);
              auVar33 = vminps_avx(auVar33,auVar44);
              auVar65 = vshufpd_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar65,auVar33);
              uVar13 = vcmpps_avx512vl(auVar44,auVar33,0);
              uVar23 = (uint)bVar19;
              if (((byte)uVar13 & bVar19) != 0) {
                bVar19 = (byte)uVar13 & bVar19;
              }
              uVar69 = 0;
              for (uVar24 = (uint)bVar19; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
                uVar69 = uVar69 + 1;
              }
              do {
                uVar20 = uVar69 & 0xff;
                uVar24 = *(uint *)(lVar28 + 0x90 + (ulong)uVar20 * 4);
                pGVar3 = (local_25f0->geometries).items[uVar24].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar19 = ~(byte)(1 << (uVar69 & 0x1f)) & (byte)uVar23;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar32 = (ulong)(uVar20 << 2);
                    uVar53 = *(undefined4 *)((long)local_2568 + uVar32);
                    uVar2 = *(undefined4 *)((long)local_2558 + uVar32);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2548 + uVar32);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2538 + uVar32);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2528 + uVar32);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2518 + uVar32);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar53;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar28 + 0xa0 + uVar32);
                    *(uint *)(ray + k * 4 + 0x120) = uVar24;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_2508 = auVar57._0_16_;
                  auVar46 = vmovdqu64_avx512vl(auVar79._0_32_);
                  uVar32 = (ulong)(uVar20 * 4);
                  uVar53 = *(undefined4 *)((long)local_2568 + uVar32);
                  h.u.field_0.i[1] = uVar53;
                  h.u.field_0.i[0] = uVar53;
                  h.u.field_0.i[2] = uVar53;
                  h.u.field_0.i[3] = uVar53;
                  h.v.field_0.v[0] = *(float *)((long)local_2558 + uVar32);
                  h.geomID.field_0 =
                       (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl();
                  uVar53 = *(undefined4 *)(lVar28 + 0xa0 + uVar32);
                  h.primID.field_0.i[1] = uVar53;
                  h.primID.field_0.i[0] = uVar53;
                  h.primID.field_0.i[2] = uVar53;
                  h.primID.field_0.i[3] = uVar53;
                  uVar53 = *(undefined4 *)(local_2538 + uVar32);
                  h.Ng.field_0._4_4_ = uVar53;
                  h.Ng.field_0._0_4_ = uVar53;
                  h.Ng.field_0._8_4_ = uVar53;
                  h.Ng.field_0._12_4_ = uVar53;
                  uVar53 = *(undefined4 *)(local_2528 + uVar32);
                  h.Ng.field_0._20_4_ = uVar53;
                  h.Ng.field_0._16_4_ = uVar53;
                  h.Ng.field_0._24_4_ = uVar53;
                  h.Ng.field_0._28_4_ = uVar53;
                  h.Ng.field_0._32_4_ = *(undefined4 *)(local_2518 + uVar32);
                  h.Ng.field_0._36_4_ = h.Ng.field_0._32_4_;
                  h.Ng.field_0._40_4_ = h.Ng.field_0._32_4_;
                  h.Ng.field_0._44_4_ = h.Ng.field_0._32_4_;
                  h.v.field_0.v[1] = h.v.field_0.v[0];
                  h.v.field_0.v[2] = h.v.field_0.v[0];
                  h.v.field_0.v[3] = h.v.field_0.v[0];
                  vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                                ZEXT1632((undefined1  [16])h.u.field_0));
                  h.instID[0].field_0.i[1] = context->user->instID[0];
                  h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
                  h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
                  h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
                  h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                  h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                  h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                  h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2548 + uVar32);
                  auVar33 = auVar80._0_16_;
                  local_2618 = vmovdqa64_avx512vl(auVar33);
                  args.valid = (int *)local_2618;
                  args.geometryUserPtr = pGVar3->userPtr;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&h;
                  args.N = 4;
                  local_24f8 = vmovdqa64_avx512vl(auVar33);
                  auVar33 = vmovdqa64_avx512vl(auVar33);
                  args.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->intersectionFilterN)(&args);
                    auVar33 = local_2618;
                  }
                  uVar32 = vptestmd_avx512vl(auVar33,auVar33);
                  if ((uVar32 & 0xf) == 0) {
LAB_0077c9a2:
                    *(float *)(ray + k * 4 + 0x80) = fVar70;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var4)(&args);
                      auVar33 = local_2618;
                    }
                    uVar32 = vptestmd_avx512vl(auVar33,auVar33);
                    uVar32 = uVar32 & 0xf;
                    bVar19 = (byte)uVar32;
                    if (bVar19 == 0) goto LAB_0077c9a2;
                    iVar1 = *(int *)(args.hit + 4);
                    iVar16 = *(int *)(args.hit + 8);
                    iVar17 = *(int *)(args.hit + 0xc);
                    bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                    bVar6 = SUB81(uVar32 >> 3,0);
                    *(uint *)(args.ray + 0xc0) =
                         (uint)(bVar19 & 1) * *(int *)args.hit |
                         (uint)!(bool)(bVar19 & 1) * *(uint *)(args.ray + 0xc0);
                    *(uint *)(args.ray + 0xc4) =
                         (uint)bVar7 * iVar1 | (uint)!bVar7 * *(int *)(args.ray + 0xc4);
                    *(uint *)(args.ray + 200) =
                         (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 200);
                    *(uint *)(args.ray + 0xcc) =
                         (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xcc);
                    iVar1 = *(int *)(args.hit + 0x14);
                    iVar16 = *(int *)(args.hit + 0x18);
                    iVar17 = *(int *)(args.hit + 0x1c);
                    bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                    bVar6 = SUB81(uVar32 >> 3,0);
                    *(uint *)(args.ray + 0xd0) =
                         (uint)(bVar19 & 1) * *(int *)(args.hit + 0x10) |
                         (uint)!(bool)(bVar19 & 1) * *(uint *)(args.ray + 0xd0);
                    *(uint *)(args.ray + 0xd4) =
                         (uint)bVar7 * iVar1 | (uint)!bVar7 * *(int *)(args.ray + 0xd4);
                    *(uint *)(args.ray + 0xd8) =
                         (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 0xd8);
                    *(uint *)(args.ray + 0xdc) =
                         (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xdc);
                    iVar1 = *(int *)(args.hit + 0x24);
                    iVar16 = *(int *)(args.hit + 0x28);
                    iVar17 = *(int *)(args.hit + 0x2c);
                    bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                    bVar6 = SUB81(uVar32 >> 3,0);
                    *(uint *)(args.ray + 0xe0) =
                         (uint)(bVar19 & 1) * *(int *)(args.hit + 0x20) |
                         (uint)!(bool)(bVar19 & 1) * *(uint *)(args.ray + 0xe0);
                    *(uint *)(args.ray + 0xe4) =
                         (uint)bVar7 * iVar1 | (uint)!bVar7 * *(int *)(args.ray + 0xe4);
                    *(uint *)(args.ray + 0xe8) =
                         (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 0xe8);
                    *(uint *)(args.ray + 0xec) =
                         (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xec);
                    iVar1 = *(int *)(args.hit + 0x34);
                    iVar16 = *(int *)(args.hit + 0x38);
                    iVar17 = *(int *)(args.hit + 0x3c);
                    bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                    bVar6 = SUB81(uVar32 >> 3,0);
                    *(uint *)(args.ray + 0xf0) =
                         (uint)(bVar19 & 1) * *(int *)(args.hit + 0x30) |
                         (uint)!(bool)(bVar19 & 1) * *(uint *)(args.ray + 0xf0);
                    *(uint *)(args.ray + 0xf4) =
                         (uint)bVar7 * iVar1 | (uint)!bVar7 * *(int *)(args.ray + 0xf4);
                    *(uint *)(args.ray + 0xf8) =
                         (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 0xf8);
                    *(uint *)(args.ray + 0xfc) =
                         (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xfc);
                    iVar1 = *(int *)(args.hit + 0x44);
                    iVar16 = *(int *)(args.hit + 0x48);
                    iVar17 = *(int *)(args.hit + 0x4c);
                    bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                    bVar6 = SUB81(uVar32 >> 3,0);
                    *(uint *)(args.ray + 0x100) =
                         (uint)(bVar19 & 1) * *(int *)(args.hit + 0x40) |
                         (uint)!(bool)(bVar19 & 1) * *(uint *)(args.ray + 0x100);
                    *(uint *)(args.ray + 0x104) =
                         (uint)bVar7 * iVar1 | (uint)!bVar7 * *(int *)(args.ray + 0x104);
                    *(uint *)(args.ray + 0x108) =
                         (uint)bVar5 * iVar16 | (uint)!bVar5 * *(int *)(args.ray + 0x108);
                    *(uint *)(args.ray + 0x10c) =
                         (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0x10c);
                    auVar33 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar33;
                    auVar33 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar33;
                    auVar33 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar33;
                    auVar33 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar33;
                    fVar70 = *(float *)(ray + k * 4 + 0x80);
                  }
                  auVar56._4_4_ = fVar70;
                  auVar56._0_4_ = fVar70;
                  auVar56._8_4_ = fVar70;
                  auVar56._12_4_ = fVar70;
                  auVar57 = ZEXT1664(local_2508);
                  uVar13 = vcmpps_avx512vl(local_2508,auVar56,2);
                  bVar19 = ~(byte)(1 << (uVar69 & 0x1f)) & (byte)uVar23 & (byte)uVar13;
                  auVar73 = ZEXT3264(auVar73._0_32_);
                  auVar74 = ZEXT3264(auVar74._0_32_);
                  auVar75 = ZEXT3264(auVar75._0_32_);
                  auVar76 = ZEXT3264(auVar76._0_32_);
                  auVar77 = ZEXT3264(auVar77._0_32_);
                  auVar78 = ZEXT3264(auVar78._0_32_);
                  auVar46 = vmovdqu64_avx512vl(auVar46);
                  auVar79 = ZEXT3264(auVar46);
                  auVar33 = vmovdqa64_avx512vl(local_24f8);
                  auVar80 = ZEXT1664(auVar33);
                  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                  auVar81 = ZEXT3264(auVar46);
                  auVar46 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                  auVar82 = ZEXT3264(auVar46);
                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar83 = ZEXT1664(auVar33);
                  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar84 = ZEXT3264(auVar46);
                  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                  auVar85 = ZEXT3264(auVar46);
                }
                uVar23 = (uint)bVar19;
                if (bVar19 == 0) break;
                auVar55._8_4_ = 0x7f800000;
                auVar55._0_8_ = 0x7f8000007f800000;
                auVar55._12_4_ = 0x7f800000;
                auVar33 = vblendmps_avx512vl(auVar55,auVar57._0_16_);
                auVar45._0_4_ =
                     (uint)(bVar19 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar19 & 1) * 0x7f800000;
                bVar7 = (bool)(bVar19 >> 1 & 1);
                auVar45._4_4_ = (uint)bVar7 * auVar33._4_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(bVar19 >> 2 & 1);
                auVar45._8_4_ = (uint)bVar7 * auVar33._8_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(bVar19 >> 3 & 1);
                auVar45._12_4_ = (uint)bVar7 * auVar33._12_4_ | (uint)!bVar7 * 0x7f800000;
                auVar33 = vshufps_avx(auVar45,auVar45,0xb1);
                auVar33 = vminps_avx(auVar33,auVar45);
                auVar65 = vshufpd_avx(auVar33,auVar33,1);
                auVar33 = vminps_avx(auVar65,auVar33);
                uVar13 = vcmpps_avx512vl(auVar45,auVar33,0);
                bVar19 = (byte)uVar13 & bVar19;
                uVar24 = uVar23;
                if (bVar19 != 0) {
                  uVar24 = (uint)bVar19;
                }
                uVar69 = 0;
                for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
                  uVar69 = uVar69 + 1;
                }
              } while( true );
            }
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != uVar25 - 8);
      }
      uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar57 = ZEXT3264(CONCAT428(uVar53,CONCAT424(uVar53,CONCAT420(uVar53,CONCAT416(uVar53,
                                                  CONCAT412(uVar53,CONCAT48(uVar53,CONCAT44(uVar53,
                                                  uVar53))))))));
    }
LAB_0077cb7a:
    if (local_25f8 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }